

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O0

void __thiscall
llvm::SmallPtrSetImplBase::CopyHelper(SmallPtrSetImplBase *this,SmallPtrSetImplBase *RHS)

{
  void **__first;
  void **__last;
  SmallPtrSetImplBase *RHS_local;
  SmallPtrSetImplBase *this_local;
  
  this->CurArraySize = RHS->CurArraySize;
  __first = RHS->CurArray;
  __last = EndPointer(RHS);
  std::copy<void_const**,void_const**>(__first,__last,this->CurArray);
  this->NumNonEmpty = RHS->NumNonEmpty;
  this->NumTombstones = RHS->NumTombstones;
  return;
}

Assistant:

void SmallPtrSetImplBase::CopyHelper(const SmallPtrSetImplBase &RHS) {
  // Copy over the new array size
  CurArraySize = RHS.CurArraySize;

  // Copy over the contents from the other set
  std::copy(RHS.CurArray, RHS.EndPointer(), CurArray);

  NumNonEmpty = RHS.NumNonEmpty;
  NumTombstones = RHS.NumTombstones;
}